

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::InterceptorDescriptor::~InterceptorDescriptor(InterceptorDescriptor *this)

{
  ~InterceptorDescriptor(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

InterceptorDescriptor::~InterceptorDescriptor() = default;